

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O3

void __thiscall wasm::LocalGetCounter::LocalGetCounter(LocalGetCounter *this,Function *func)

{
  (this->super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
  super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.replacep =
       (Expression **)0x0;
  (this->super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
  super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.stack.usedFixed =
       0;
  (this->super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
  super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
           super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
           super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
  super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.currFunction =
       (Function *)0x0;
  (this->super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>).
  super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.currModule =
       (Module *)0x0;
  (this->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  analyze(this,func,func->body);
  return;
}

Assistant:

LocalGetCounter(Function* func) { analyze(func, func->body); }